

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

ssize_t nghttp2_hd_inflate_hd_nv
                  (nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out,int *inflate_flags,
                  uint8_t *in,size_t inlen,int in_final)

{
  nghttp2_buf *buf;
  byte *last;
  byte bVar1;
  nghttp2_rcbuf **ppnVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  ssize_t sVar6;
  size_t sVar7;
  ulong maxlen;
  undefined4 uVar8;
  undefined4 uVar9;
  int rfin;
  byte *local_98;
  nghttp2_hd_nv *local_90;
  int local_84;
  uint8_t *local_80;
  nghttp2_buf *local_78;
  size_t local_70;
  nghttp2_rcbuf **local_68;
  nghttp2_rcbuf **local_60;
  nghttp2_hd_huff_decode_context *local_58;
  nghttp2_mem *local_50;
  nghttp2_hd_nv nv;
  
  rfin = 0;
  if ((inflater->ctx).bad != '\0') {
    return -0x20b;
  }
  last = in + inlen;
  local_50 = (inflater->ctx).mem;
  local_90 = nv_out;
  local_84 = in_final;
  local_70 = inlen;
  hd_inflate_keep_free(inflater);
  *inflate_flags = 0;
  local_58 = &inflater->huff_decode_ctx;
  local_60 = &inflater->valuercbuf;
  local_78 = &inflater->valuebuf;
  buf = &inflater->namebuf;
  local_68 = &inflater->namercbuf;
  bVar1 = 0;
  local_98 = (byte *)inflate_flags;
  local_80 = in;
switchD_00164ef3_default:
  if ((bool)(in == last & (bVar1 ^ 1))) {
    if (local_84 == 0) {
      return local_70;
    }
    sVar6 = -0x20b;
    if (inflater->state - NGHTTP2_HD_STATE_INFLATE_START < 2) {
      *local_98 = *local_98 | 1;
      return local_70;
    }
    goto LAB_00165440;
  }
  bVar1 = 0;
  switch(inflater->state) {
  case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
    if ((*in & 0xe0) != 0x20) {
LAB_0016534f:
      sVar6 = -0x20b;
      goto LAB_00165440;
    }
LAB_00165030:
    uVar5 = 0x300000001;
LAB_0016503a:
    inflater->opcode = (int)uVar5;
    inflater->state = (int)((ulong)uVar5 >> 0x20);
    break;
  case NGHTTP2_HD_STATE_INFLATE_START:
  case NGHTTP2_HD_STATE_OPCODE:
    bVar1 = *in;
    if ((bVar1 & 0xe0) == 0x20) {
      if (inflater->state == NGHTTP2_HD_STATE_OPCODE) goto LAB_0016534f;
      goto LAB_00165030;
    }
    if ((char)bVar1 < '\0') {
      uVar5 = 0x400000001;
      goto LAB_0016503a;
    }
    lVar4 = 1;
    uVar8 = 2;
    uVar9 = 5;
    if (bVar1 != 0) {
      uVar8 = 2;
      uVar9 = 5;
      if (bVar1 != 0x10) {
        uVar8 = 2;
        uVar9 = 5;
        if (bVar1 != 0x40) {
          lVar4 = 0;
          uVar8 = 3;
          uVar9 = 4;
        }
      }
    }
    inflater->opcode = uVar8;
    inflater->state = uVar9;
    inflater->index_required = *in >> 6 & 1;
    inflater->no_index = (*in & 0xf0) == 0x10;
    in = in + lVar4;
    break;
  case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
    rfin = 0;
    maxlen = inflater->settings_hd_table_bufsize_max;
    if (inflater->min_hd_table_bufsize_max < inflater->settings_hd_table_bufsize_max) {
      maxlen = inflater->min_hd_table_bufsize_max;
    }
    sVar6 = hd_inflate_read_len(inflater,&rfin,in,last,5,maxlen);
    if (sVar6 < 0) goto LAB_00165440;
    in = in + sVar6;
    if (rfin == 0) goto LAB_00165399;
    inflater->min_hd_table_bufsize_max = 0xffffffff;
    (inflater->ctx).hd_table_bufsize_max = inflater->left;
    bVar1 = 0;
    hd_context_shrink_table_size(&inflater->ctx,(nghttp2_hd_map *)0x0);
    inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
    goto switchD_00164ef3_default;
  case NGHTTP2_HD_STATE_READ_INDEX:
    sVar7 = 7;
    if (inflater->opcode != NGHTTP2_HD_OPCODE_INDEXED) {
      sVar7 = (ulong)(inflater->index_required != '\0') * 2 + 4;
    }
    rfin = 0;
    sVar6 = hd_inflate_read_len(inflater,&rfin,in,last,sVar7,(inflater->ctx).hd_table.len + 0x3d);
    if (sVar6 < 0) goto LAB_00165440;
    in = in + sVar6;
    if (rfin == 0) goto LAB_00165399;
    if (inflater->left == 0) goto LAB_0016534f;
    sVar7 = inflater->left - 1;
    inflater->index = sVar7;
    if (inflater->opcode != NGHTTP2_HD_OPCODE_INDEXED) {
      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
      goto LAB_001652f2;
    }
    nghttp2_hd_table_get(&nv,&inflater->ctx,sVar7);
    local_90->token = nv.token;
    local_90->flags = nv.flags;
    *(undefined3 *)&local_90->field_0x15 = nv._21_3_;
    local_90->name = nv.name;
    local_90->value = nv.value;
    inflater->state = NGHTTP2_HD_STATE_OPCODE;
    *local_98 = *local_98 | 2;
    goto LAB_001653e3;
  case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
    inflater->huffman_encoded = *in >> 7;
    inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
    inflater->left = 0;
    inflater->shift = 0;
  case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
    rfin = 0;
    sVar6 = hd_inflate_read_len(inflater,&rfin,in,last,7,0x10000);
    if (sVar6 < 0) goto LAB_00165440;
    in = in + sVar6;
    if (rfin == 0) goto LAB_00165399;
    if (inflater->huffman_encoded == '\0') {
      inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
      sVar7 = inflater->left;
    }
    else {
      nghttp2_hd_huff_decode_context_init(local_58);
      inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;
      sVar7 = inflater->left * 2;
    }
    ppnVar2 = local_68;
    iVar3 = nghttp2_rcbuf_new(local_68,sVar7 + 1,local_50);
    if (iVar3 != 0) goto LAB_0016543e;
    nghttp2_buf_wrap_init(buf,(*ppnVar2)->base,(*ppnVar2)->len);
LAB_001652f2:
    bVar1 = 0;
    goto switchD_00164ef3_default;
  case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
    sVar6 = hd_inflate_read_huff(inflater,buf,in,last);
    goto LAB_001650ff;
  case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
    sVar6 = hd_inflate_read(inflater,buf,in,last);
LAB_001650ff:
    if (sVar6 < 0) goto LAB_00165440;
    in = in + sVar6;
    if (inflater->left != 0) goto LAB_00165399;
    *(inflater->namebuf).last = '\0';
    inflater->namercbuf->len = (long)(inflater->namebuf).last - (long)(inflater->namebuf).pos;
    inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
    bVar1 = 0;
    goto switchD_00164ef3_default;
  case NGHTTP2_HD_STATE_CHECK_VALUELEN:
    inflater->huffman_encoded = *in >> 7;
    inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
    inflater->left = 0;
    inflater->shift = 0;
  case NGHTTP2_HD_STATE_READ_VALUELEN:
    rfin = 0;
    sVar6 = hd_inflate_read_len(inflater,&rfin,in,last,7,0x10000);
    if (sVar6 < 0) goto LAB_00165440;
    in = in + sVar6;
    if (rfin == 0) goto LAB_00165399;
    if (inflater->huffman_encoded == '\0') {
      inflater->state = NGHTTP2_HD_STATE_READ_VALUE;
      sVar7 = inflater->left;
    }
    else {
      nghttp2_hd_huff_decode_context_init(local_58);
      inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;
      sVar7 = inflater->left * 2;
    }
    ppnVar2 = local_60;
    iVar3 = nghttp2_rcbuf_new(local_60,sVar7 + 1,local_50);
    if (iVar3 != 0) goto LAB_0016543e;
    nghttp2_buf_wrap_init(local_78,(*ppnVar2)->base,(*ppnVar2)->len);
    bVar1 = 1;
    goto switchD_00164ef3_default;
  case NGHTTP2_HD_STATE_READ_VALUEHUFF:
    goto switchD_00164ef3_caseD_b;
  case NGHTTP2_HD_STATE_READ_VALUE:
    sVar6 = hd_inflate_read(inflater,local_78,in,last);
    goto LAB_00165383;
  default:
    goto switchD_00164ef3_default;
  }
  inflater->left = 0;
  inflater->shift = 0;
  bVar1 = 0;
  goto switchD_00164ef3_default;
switchD_00164ef3_caseD_b:
  sVar6 = hd_inflate_read_huff(inflater,local_78,in,last);
LAB_00165383:
  if (-1 < sVar6) {
    in = in + sVar6;
    if (inflater->left == 0) {
      *(inflater->valuebuf).last = '\0';
      inflater->valuercbuf->len = (long)(inflater->valuebuf).last - (long)(inflater->valuebuf).pos;
      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        iVar3 = hd_inflate_commit_newname(inflater,local_90);
      }
      else {
        iVar3 = hd_inflate_commit_indname(inflater,local_90);
      }
      if (iVar3 == 0) {
        inflater->state = NGHTTP2_HD_STATE_OPCODE;
        *local_98 = *local_98 | 2;
        goto LAB_001653e3;
      }
LAB_0016543e:
      sVar6 = (ssize_t)iVar3;
    }
    else {
LAB_00165399:
      sVar6 = -0x20b;
      if (local_84 == 0) {
LAB_001653e3:
        return (long)in - (long)local_80;
      }
    }
  }
LAB_00165440:
  (inflater->ctx).bad = '\x01';
  return sVar6;
}

Assistant:

ssize_t nghttp2_hd_inflate_hd_nv(nghttp2_hd_inflater *inflater,
                                 nghttp2_hd_nv *nv_out, int *inflate_flags,
                                 const uint8_t *in, size_t inlen,
                                 int in_final) {
  ssize_t rv = 0;
  const uint8_t *first = in;
  const uint8_t *last = in + inlen;
  int rfin = 0;
  int busy = 0;
  nghttp2_mem *mem;

  mem = inflater->ctx.mem;

  if (inflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  DEBUGF("inflatehd: start state=%d\n", inflater->state);
  hd_inflate_keep_free(inflater);
  *inflate_flags = NGHTTP2_HD_INFLATE_NONE;
  for (; in != last || busy;) {
    busy = 0;
    switch (inflater->state) {
    case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
      if ((*in & 0xe0u) != 0x20u) {
        DEBUGF("inflatehd: header table size change was expected, but saw "
               "0x%02x as first byte",
               *in);
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }
    /* fall through */
    case NGHTTP2_HD_STATE_INFLATE_START:
    case NGHTTP2_HD_STATE_OPCODE:
      if ((*in & 0xe0u) == 0x20u) {
        DEBUGF("inflatehd: header table size change\n");
        if (inflater->state == NGHTTP2_HD_STATE_OPCODE) {
          DEBUGF("inflatehd: header table size change must appear at the head "
                 "of header block\n");
          rv = NGHTTP2_ERR_HEADER_COMP;
          goto fail;
        }
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_TABLE_SIZE;
      } else if (*in & 0x80u) {
        DEBUGF("inflatehd: indexed repr\n");
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
      } else {
        if (*in == 0x40u || *in == 0 || *in == 0x10u) {
          DEBUGF("inflatehd: literal header repr - new name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_NEWNAME;
          inflater->state = NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN;
        } else {
          DEBUGF("inflatehd: literal header repr - indexed name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_INDNAME;
          inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
        }
        inflater->index_required = (*in & 0x40) != 0;
        inflater->no_index = (*in & 0xf0u) == 0x10u;
        DEBUGF("inflatehd: indexing required=%d, no_index=%d\n",
               inflater->index_required, inflater->no_index);
        if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
          ++in;
        }
      }
      inflater->left = 0;
      inflater->shift = 0;
      break;
    case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
      rfin = 0;
      rv = hd_inflate_read_len(
          inflater, &rfin, in, last, 5,
          nghttp2_min(inflater->min_hd_table_bufsize_max,
                      inflater->settings_hd_table_bufsize_max));
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        goto almost_ok;
      }
      DEBUGF("inflatehd: table_size=%zu\n", inflater->left);
      inflater->min_hd_table_bufsize_max = UINT32_MAX;
      inflater->ctx.hd_table_bufsize_max = inflater->left;
      hd_context_shrink_table_size(&inflater->ctx, NULL);
      inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
      break;
    case NGHTTP2_HD_STATE_READ_INDEX: {
      size_t prefixlen;

      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        prefixlen = 7;
      } else if (inflater->index_required) {
        prefixlen = 6;
      } else {
        prefixlen = 4;
      }

      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, prefixlen,
                               get_max_index(&inflater->ctx));
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      if (inflater->left == 0) {
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }

      DEBUGF("inflatehd: index=%zu\n", inflater->left);
      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        inflater->index = inflater->left;
        --inflater->index;

        hd_inflate_commit_indexed(inflater, nv_out);

        inflater->state = NGHTTP2_HD_STATE_OPCODE;
        *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;
        return (ssize_t)(in - first);
      } else {
        inflater->index = inflater->left;
        --inflater->index;

        inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
      }
      break;
    }
    case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        DEBUGF("inflatehd: integer not fully decoded. current=%zu\n",
               inflater->left);

        goto almost_ok;
      }

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->namebuf, inflater->namercbuf->base,
                            inflater->namercbuf->len);

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
      rv = hd_inflate_read(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);
      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_CHECK_VALUELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_READ_VALUELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      DEBUGF("inflatehd: valuelen=%zu\n", inflater->left);

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_READ_VALUE;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->valuebuf, inflater->valuercbuf->base,
                            inflater->valuercbuf->len);

      busy = 1;

      break;
    case NGHTTP2_HD_STATE_READ_VALUEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    case NGHTTP2_HD_STATE_READ_VALUE:
      rv = hd_inflate_read(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        DEBUGF("inflatehd: value read failure %zd: %s\n", rv,
               nghttp2_strerror((int)rv));
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);
        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    }
  }

  assert(in == last);

  DEBUGF("inflatehd: all input bytes were processed\n");

  if (in_final) {
    DEBUGF("inflatehd: in_final set\n");

    if (inflater->state != NGHTTP2_HD_STATE_OPCODE &&
        inflater->state != NGHTTP2_HD_STATE_INFLATE_START) {
      DEBUGF("inflatehd: unacceptable state=%d\n", inflater->state);
      rv = NGHTTP2_ERR_HEADER_COMP;

      goto fail;
    }
    *inflate_flags |= NGHTTP2_HD_INFLATE_FINAL;
  }
  return (ssize_t)(in - first);

almost_ok:
  if (in_final) {
    DEBUGF("inflatehd: input ended prematurely\n");

    rv = NGHTTP2_ERR_HEADER_COMP;

    goto fail;
  }
  return (ssize_t)(in - first);

fail:
  DEBUGF("inflatehd: error return %zd\n", rv);

  inflater->ctx.bad = 1;
  return rv;
}